

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_bytes.cpp
# Opt level: O2

void duckdb::FormatBytesFunction<1000l>(DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  reference vector;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *pUVar9;
  reference pvVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  idx_t extraout_RDX;
  unsigned_long *extraout_RDX_00;
  _Head_base<0UL,_unsigned_long_*,_false> idx;
  idx_t extraout_RDX_01;
  idx_t idx_00;
  idx_t iVar12;
  TemplatedValidityMask<unsigned_long> *other;
  element_type *peVar13;
  ulong uVar14;
  VectorType VVar15;
  element_type *peVar16;
  undefined8 *puVar17;
  idx_t *piVar18;
  UnifiedVectorFormat *pUVar19;
  ulong uVar20;
  string_t sVar21;
  anon_struct_16_3_d7536bce_for_pointer aVar22;
  ValidityMask local_a8;
  ulong local_88;
  long local_80;
  long *local_78;
  long local_70;
  long local_68;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  VVar15 = (VectorType)result;
  local_a8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)result;
  if (*vector == (value_type)0x0) {
    pvVar10 = vector;
    duckdb::Vector::SetVectorType(VVar15);
    lVar6 = *(long *)(result + 0x20);
    lVar4 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if (*(long *)(vector + 0x28) == 0) {
      piVar18 = (idx_t *)(lVar6 + 8);
      iVar12 = extraout_RDX;
      for (pUVar19 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar19; pUVar19 = pUVar19 + 1) {
        sVar21 = UnaryLambdaWrapper::
                 Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                           (*(long *)(lVar4 + (long)pUVar19 * 8),&local_a8,iVar12,pvVar10);
        iVar12 = sVar21.value._8_8_;
        piVar18[-1] = sVar21.value._0_8_;
        *piVar18 = iVar12;
        piVar18 = piVar18 + 2;
      }
    }
    else {
      other = (TemplatedValidityMask<unsigned_long> *)(vector + 0x28);
      TemplatedValidityMask<unsigned_long>::Initialize
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),other);
      local_88 = (ulong)(pUVar1 + 0x3f) >> 6;
      peVar16 = (element_type *)(lVar6 + 8);
      idx._M_head_impl = extraout_RDX_00;
      pUVar19 = (UnifiedVectorFormat *)0x0;
      local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar16;
      local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
      for (uVar14 = 0; uVar14 != local_88; uVar14 = uVar14 + 1) {
        if (other->validity_mask == (unsigned_long *)0x0) {
          pUVar9 = pUVar19 + 0x40;
          if (pUVar1 <= pUVar19 + 0x40) {
            pUVar9 = pUVar1;
          }
LAB_007a5ab6:
          peVar13 = peVar16 + (long)pUVar19 * 2;
          for (; pUVar8 = pUVar19,
              _Var11._M_pi = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi, pUVar19 < pUVar9; pUVar19 = pUVar19 + 1) {
            sVar21 = UnaryLambdaWrapper::
                     Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                               (*(long *)(lVar4 + (long)pUVar19 * 8),&local_a8,
                                (idx_t)idx._M_head_impl,other);
            idx._M_head_impl = sVar21.value._8_8_;
            peVar13[-1].owned_data.
            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false> = (unsigned_long *)sVar21.value._0_8_;
            (peVar13->owned_data).
            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false> =
                 (_Head_base<0UL,_unsigned_long_*,_false>)idx._M_head_impl;
            peVar13 = peVar13 + 2;
          }
        }
        else {
          uVar5 = other->validity_mask[uVar14];
          pUVar9 = pUVar19 + 0x40;
          if (pUVar1 <= pUVar19 + 0x40) {
            pUVar9 = pUVar1;
          }
          peVar16 = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          if (uVar5 == 0xffffffffffffffff) goto LAB_007a5ab6;
          pUVar8 = pUVar9;
          _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
          if (uVar5 != 0) {
            peVar13 = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + (long)pUVar19 * 2;
            local_80 = (long)pUVar19 * 8 + lVar4;
            local_a8.super_TemplatedValidityMask<unsigned_long>.capacity = uVar14;
            for (uVar20 = 0; pUVar8 = pUVar19 + uVar20,
                _Var11._M_pi = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                               internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,
                uVar14 = local_a8.super_TemplatedValidityMask<unsigned_long>.capacity,
                peVar16 = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                          .
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr, pUVar19 + uVar20 < pUVar9; uVar20 = uVar20 + 1) {
              if ((uVar5 >> (uVar20 & 0x3f) & 1) != 0) {
                sVar21 = UnaryLambdaWrapper::
                         Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                                   (*(long *)(local_80 + uVar20 * 8),&local_a8,
                                    (idx_t)idx._M_head_impl,other);
                idx._M_head_impl = sVar21.value._8_8_;
                peVar13[-1].owned_data.
                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false> =
                     ((unsigned_long *)sVar21.value._0_8_)._M_head_impl;
                (peVar13->owned_data).
                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false> =
                     (_Head_base<0UL,_unsigned_long_*,_false>)idx._M_head_impl;
              }
              peVar13 = peVar13 + 2;
            }
          }
        }
        other = (TemplatedValidityMask<unsigned_long> *)_Var11._M_pi;
        pUVar19 = pUVar8;
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    pvVar10 = vector;
    duckdb::Vector::SetVectorType(VVar15);
    paVar2 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    plVar3 = *(long **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) != (byte *)0x0) && ((**(byte **)(vector + 0x28) & 1) == 0)) {
      duckdb::ConstantVector::SetNull(result,true);
      return;
    }
    duckdb::ConstantVector::SetNull(result,false);
    aVar22 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapper::
             Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                       (*plVar3,&local_a8,idx_00,pvVar10);
    paVar2->pointer = aVar22;
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar1);
    duckdb::Vector::SetVectorType(VVar15);
    lVar6 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      piVar18 = (idx_t *)(lVar6 + 8);
      iVar12 = extraout_RDX_01;
      for (pUVar19 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar19; pUVar19 = pUVar19 + 1) {
        pvVar7 = (void *)*local_78;
        pUVar9 = pUVar19;
        if (pvVar7 != (void *)0x0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)((long)pvVar7 + (long)pUVar19 * 4);
        }
        sVar21 = UnaryLambdaWrapper::
                 Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                           (*(long *)(local_70 + (long)pUVar9 * 8),&local_a8,iVar12,pvVar7);
        iVar12 = sVar21.value._8_8_;
        piVar18[-1] = sVar21.value._0_8_;
        *piVar18 = iVar12;
        piVar18 = piVar18 + 2;
      }
    }
    else {
      puVar17 = (undefined8 *)(lVar6 + 8);
      for (pUVar19 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar19; pUVar19 = pUVar19 + 1) {
        pUVar9 = pUVar19;
        if (*local_78 != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_78 + (long)pUVar19 * 4);
        }
        pvVar7 = *(void **)(local_68 + ((ulong)pUVar9 >> 6) * 8);
        if (((ulong)pvVar7 >> ((ulong)pUVar9 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar19);
        }
        else {
          sVar21 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(local_70 + (long)pUVar9 * 8),&local_a8,(ulong)pUVar9 >> 6,
                              pvVar7);
          puVar17[-1] = sVar21.value._0_8_;
          *puVar17 = sVar21.value._8_8_;
        }
        puVar17 = puVar17 + 2;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  }
  return;
}

Assistant:

static void FormatBytesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<int64_t, string_t>(args.data[0], result, args.size(), [&](int64_t bytes) {
		bool is_negative = bytes < 0;
		idx_t unsigned_bytes;
		if (bytes < 0) {
			if (bytes == NumericLimits<int64_t>::Minimum()) {
				unsigned_bytes = idx_t(NumericLimits<int64_t>::Maximum()) + 1;
			} else {
				unsigned_bytes = idx_t(-bytes);
			}
		} else {
			unsigned_bytes = idx_t(bytes);
		}
		return StringVector::AddString(result, (is_negative ? "-" : "") +
		                                           StringUtil::BytesToHumanReadableString(unsigned_bytes, MULTIPLIER));
	});
}